

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Person.cpp
# Opt level: O3

void __thiscall Person::Person(Person *this,Person *person,Address *address)

{
  pointer pcVar1;
  
  this->_vptr_Person = (_func_int **)&PTR_validate_00121a90;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->id)._M_dataplus._M_p = (pointer)&(this->id).field_2;
  (this->id)._M_string_length = 0;
  (this->id).field_2._M_local_buf[0] = '\0';
  (this->address).country._M_dataplus._M_p = (pointer)&(this->address).country.field_2;
  pcVar1 = (address->country)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->address,pcVar1,pcVar1 + (address->country)._M_string_length);
  (this->address).city._M_dataplus._M_p = (pointer)&(this->address).city.field_2;
  pcVar1 = (address->city)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->address).city,pcVar1,pcVar1 + (address->city)._M_string_length);
  (this->address).street._M_dataplus._M_p = (pointer)&(this->address).street.field_2;
  pcVar1 = (address->street)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->address).street,pcVar1,pcVar1 + (address->street)._M_string_length);
  std::__cxx11::string::_M_assign((string *)&this->name);
  std::__cxx11::string::_M_assign((string *)&this->id);
  return;
}

Assistant:

Person::Person(const Person &person, Address address) : address(address) {

    this->name = person.name;
    this->id = person.id;
}